

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O0

bool IsKnownShellSafeCharacter(char ch)

{
  int iVar1;
  bool local_9;
  char ch_local;
  
  if ((ch < 'A') || ('Z' < ch)) {
    if ((ch < 'a') || ('z' < ch)) {
      if ((ch < '0') || ('9' < ch)) {
        iVar1 = (int)ch;
        if ((iVar1 == 0x2b) || ((iVar1 - 0x2dU < 3 || (iVar1 == 0x5f)))) {
          local_9 = true;
        }
        else {
          local_9 = false;
        }
      }
      else {
        local_9 = true;
      }
    }
    else {
      local_9 = true;
    }
  }
  else {
    local_9 = true;
  }
  return local_9;
}

Assistant:

static inline bool IsKnownShellSafeCharacter(char ch) {
  if ('A' <= ch && ch <= 'Z') return true;
  if ('a' <= ch && ch <= 'z') return true;
  if ('0' <= ch && ch <= '9') return true;

  switch (ch) {
    case '_':
    case '+':
    case '-':
    case '.':
    case '/':
      return true;
    default:
      return false;
  }
}